

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.cpp
# Opt level: O0

void arbitrary_json_notification(json *value)

{
  string local_30;
  json *local_10;
  json *value_local;
  
  local_10 = value;
  nlohmann::
  to_string<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (&local_30,value);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void arbitrary_json_notification(const json& value) {
  to_string(value);
}